

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ClientSession::send_keep_alive(ClientSession *this)

{
  uint16_t session_id;
  uint16_t milliseconds_00;
  rep rVar1;
  undefined8 uVar2;
  undefined1 local_50 [8];
  ClientKeepAlive keep_alive;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  rep local_30;
  rep milliseconds;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<60L>_>_> minutes;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  type time_since_establish;
  ClientSession *this_local;
  
  if (((&this->field_0x38)[(long)this->_vptr_ClientSession[-3]] & 1) == 0) {
    (&this->field_0x38)[(long)this->_vptr_ClientSession[-3]] = 1;
    time_since_establish.__r = (rep)this;
    minutes.__r = std::chrono::_V2::steady_clock::now();
    local_18.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&minutes,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)(&this->field_0x20 + (long)this->_vptr_ClientSession[-3]));
    milliseconds = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_18);
    keep_alive._8_8_ =
         std::chrono::operator-(&local_18,(duration<long,_std::ratio<60L,_1L>_> *)&milliseconds);
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   &keep_alive.m_session_id);
    local_30 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
    session_id = *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ClientSession[-3]);
    milliseconds_00 = (uint16_t)local_30;
    rVar1 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count
                      ((duration<long,_std::ratio<60L,_1L>_> *)&milliseconds);
    control::ClientKeepAlive::ClientKeepAlive
              ((ClientKeepAlive *)local_50,session_id,milliseconds_00,(uint16_t)rVar1);
    Session::send_packet
              ((Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),
               true,'\x03',(Serializable *)local_50);
    uVar2 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(&this->field_0x30 + (long)this->_vptr_ClientSession[-3]) = uVar2;
    control::ClientKeepAlive::~ClientKeepAlive((ClientKeepAlive *)local_50);
  }
  return;
}

Assistant:

void ClientSession::send_keep_alive()
	{
		// Don't send a keep alive if we're waiting for a response
		if (m_waiting_for_keep_alive_response)
			return;
		m_waiting_for_keep_alive_response = true;

		// Work out how many minutes have been since the establish time, and
		// how many milliseconds we are in to the current minute.
		const auto time_since_establish = std::chrono::steady_clock::now() - m_establish_time;
		const auto minutes = std::chrono::duration_cast<std::chrono::minutes>(time_since_establish);
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			time_since_establish - minutes
		).count();

		// Send a KEEP_ALIVE packet
		control::ClientKeepAlive keep_alive(m_id, milliseconds, minutes.count());
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE, keep_alive);
		m_last_sent_heartbeat_time = std::chrono::steady_clock::now();
	}